

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeDataCount(WasmBinaryWriter *this)

{
  Module *pMVar1;
  int32_t start;
  
  pMVar1 = this->wasm;
  if ((((pMVar1->features).features & 0x10) != 0) &&
     ((pMVar1->dataSegments).
      super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pMVar1->dataSegments).
      super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    start = startSection<wasm::BinaryConsts::Section>(this,DataCount);
    BufferWithRandomAccess::operator<<
              (this->o,(U32LEB)(uint)((ulong)((long)(this->wasm->dataSegments).
                                                                                                        
                                                  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->wasm->dataSegments).
                                                                                                      
                                                  super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
    finishSection(this,start);
    return;
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDataCount() {
  if (!wasm->features.hasBulkMemory() || !wasm->dataSegments.size()) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::DataCount);
  o << U32LEB(wasm->dataSegments.size());
  finishSection(start);
}